

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ConvolutionLayerParams::MergePartialFromCodedStream
          (ConvolutionLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  int length;
  uint uVar5;
  int iVar6;
  uint32 uVar7;
  WeightParams *this_00;
  unsigned_long uVar8;
  uint8 *puVar9;
  pair<int,_int> pVar10;
  ValidPadding *this_01;
  SamePadding *this_02;
  RepeatedField<unsigned_long> *pRVar11;
  char cVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  
LAB_00224aba:
  pbVar3 = input->buffer_;
  uVar7 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar13 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar5 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar7 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
      goto LAB_0022503a;
      uVar13 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar13 = uVar13 | 0x100000000;
  }
  else {
LAB_0022503a:
    uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar13 = 0;
    if (uVar7 - 1 < 0x3fff) {
      uVar13 = 0x100000000;
    }
    uVar13 = uVar7 | uVar13;
  }
  uVar7 = (uint32)uVar13;
  if ((uVar13 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar12 = (char)uVar13;
    if (uVar5 < 0x32) {
      if (0x13 < uVar5) {
        if (uVar5 != 0x14) {
          if (uVar5 == 0x1e) {
            if (cVar12 == -0x10) {
              uVar7 = 0xf2;
              pRVar11 = &this->stride_;
              goto LAB_00224e9f;
            }
            pRVar11 = &this->stride_;
            if ((uVar7 & 0xff) == 0xf2) goto LAB_00224e14;
          }
          else if (uVar5 == 0x28) {
            if (cVar12 == '@') {
              uVar7 = 0x142;
              pRVar11 = &this->dilationfactor_;
              goto LAB_00224e9f;
            }
            pRVar11 = &this->dilationfactor_;
            if ((uVar7 & 0xff) == 0x42) goto LAB_00224e14;
          }
          goto LAB_00224b17;
        }
        if (cVar12 == -0x60) {
          uVar7 = 0xa2;
          pRVar11 = &this->kernelsize_;
LAB_00224e9f:
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (2,uVar7,input,pRVar11);
        }
        else {
          pRVar11 = &this->kernelsize_;
          if ((uVar7 & 0xff) != 0xa2) goto LAB_00224b17;
LAB_00224e14:
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (input,pRVar11);
        }
        goto LAB_00224b37;
      }
      if (uVar5 == 1) {
        if (cVar12 == '\b') {
          puVar9 = input->buffer_;
          if ((puVar9 < input->buffer_end_) && (-1 < (long)(char)*puVar9)) {
            this->outputchannels_ = (long)(char)*puVar9;
            goto LAB_00224ded;
          }
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->outputchannels_ = pVar14.first;
          goto LAB_00224fc0;
        }
        goto LAB_00224b17;
      }
      if (uVar5 == 2) {
        if (cVar12 == '\x10') {
          puVar9 = input->buffer_;
          if ((puVar9 < input->buffer_end_) && (-1 < (long)(char)*puVar9)) {
            this->kernelchannels_ = (long)(char)*puVar9;
            goto LAB_00224ded;
          }
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->kernelchannels_ = pVar14.first;
          goto LAB_00224fc0;
        }
        goto LAB_00224b17;
      }
      if ((uVar5 != 10) || (cVar12 != 'P')) goto LAB_00224b17;
      puVar9 = input->buffer_;
      if ((puVar9 < input->buffer_end_) && (-1 < (long)(char)*puVar9)) {
        this->ngroups_ = (long)(char)*puVar9;
LAB_00224ded:
        input->buffer_ = puVar9 + 1;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->ngroups_ = pVar14.first;
LAB_00224fc0:
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      goto LAB_00224aba;
    }
    if (uVar5 < 0x46) {
      if (uVar5 == 0x32) {
        if (cVar12 == -0x6e) {
          if (this->_oneof_case_[0] == 0x32) {
            this_01 = (this->ConvolutionPaddingType_).valid_;
          }
          else {
            clear_ConvolutionPaddingType(this);
            this->_oneof_case_[0] = 0x32;
            this_01 = (ValidPadding *)operator_new(0x20);
            ValidPadding::ValidPadding(this_01);
            (this->ConvolutionPaddingType_).valid_ = this_01;
          }
          puVar9 = input->buffer_;
          if ((puVar9 < input->buffer_end_) && (iVar6 = (int)(char)*puVar9, -1 < iVar6)) {
            input->buffer_ = puVar9 + 1;
          }
          else {
            iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar6 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar6);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar4 = ValidPadding::MergePartialFromCodedStream(this_01,input);
LAB_00225026:
          if (bVar4 == false) {
            return false;
          }
          bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar10.first);
          goto LAB_00224b37;
        }
      }
      else if (uVar5 == 0x33) {
        if (cVar12 == -0x66) {
          if (this->_oneof_case_[0] == 0x33) {
            this_02 = (this->ConvolutionPaddingType_).same_;
          }
          else {
            clear_ConvolutionPaddingType(this);
            this->_oneof_case_[0] = 0x33;
            this_02 = (SamePadding *)operator_new(0x18);
            SamePadding::SamePadding(this_02);
            (this->ConvolutionPaddingType_).same_ = this_02;
          }
          puVar9 = input->buffer_;
          if ((puVar9 < input->buffer_end_) && (iVar6 = (int)(char)*puVar9, -1 < iVar6)) {
            input->buffer_ = puVar9 + 1;
          }
          else {
            iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar6 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar6);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar4 = SamePadding::MergePartialFromCodedStream(this_02,input);
          goto LAB_00225026;
        }
      }
      else if ((uVar5 == 0x3c) && (cVar12 == -0x20)) {
        puVar9 = input->buffer_;
        if ((puVar9 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar9, -1 < (long)uVar8)) {
          input->buffer_ = puVar9 + 1;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar14.first;
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->isdeconvolution_ = uVar8 != 0;
        goto LAB_00224aba;
      }
    }
    else if (uVar5 < 0x5b) {
      if (uVar5 == 0x46) {
        if (cVar12 != '0') goto LAB_00224b17;
        puVar9 = input->buffer_;
        if ((puVar9 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar9, -1 < (long)uVar8)) {
          input->buffer_ = puVar9 + 1;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar14.first;
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->hasbias_ = uVar8 != 0;
        goto LAB_00224aba;
      }
      if ((uVar5 == 0x5a) && (cVar12 == -0x2e)) {
        this_00 = this->weights_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->weights_ = this_00;
        }
LAB_00224d09:
        puVar9 = input->buffer_;
        if ((puVar9 < input->buffer_end_) && (iVar6 = (int)(char)*puVar9, -1 < iVar6)) {
          input->buffer_ = puVar9 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar6);
        if ((long)pVar10 < 0) {
          return false;
        }
        bVar4 = WeightParams::MergePartialFromCodedStream(this_00,input);
        goto LAB_00225026;
      }
    }
    else if (uVar5 == 0x5b) {
      if (cVar12 == -0x26) {
        this_00 = this->bias_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->bias_ = this_00;
        }
        goto LAB_00224d09;
      }
    }
    else if (uVar5 == 100) {
      if (cVar12 == ' ') {
        uVar7 = 0x322;
        pRVar11 = &this->outputshape_;
        goto LAB_00224e9f;
      }
      pRVar11 = &this->outputshape_;
      if ((uVar7 & 0xff) == 0x22) goto LAB_00224e14;
    }
  }
LAB_00224b17:
  if (uVar7 == 0) {
    return true;
  }
  if ((uVar7 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_00224b37:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_00224aba;
}

Assistant:

bool ConvolutionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ConvolutionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 outputChannels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 kernelChannels = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &kernelchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 nGroups = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &ngroups_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 kernelSize = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_kernelsize())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(160u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 162u, input, this->mutable_kernelsize())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 stride = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_stride())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(240u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 242u, input, this->mutable_stride())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 dilationFactor = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_dilationfactor())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(320u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 322u, input, this->mutable_dilationfactor())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ValidPadding valid = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_valid()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SamePadding same = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_same()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isDeconvolution = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(480u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isdeconvolution_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(560u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 90;
      case 90: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(722u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 91;
      case 91: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(730u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 outputShape = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_outputshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(800u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 802u, input, this->mutable_outputshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ConvolutionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ConvolutionLayerParams)
  return false;
#undef DO_
}